

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_base_clock(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  envy_bios_power_base_clock_entry *peVar6;
  uint16_t *puVar7;
  uint uVar8;
  ulong uVar9;
  uint16_t uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  
  uVar8 = (bios->power).base_clock.offset;
  if ((ulong)uVar8 == 0) {
    return -0x16;
  }
  if (uVar8 < bios->length) {
    (bios->power).base_clock.version = bios->data[uVar8];
  }
  else {
    (bios->power).base_clock.version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
  }
  uVar1 = (bios->power).base_clock.version;
  if (uVar1 == ' ') {
    uVar8 = (bios->power).base_clock.offset + 1;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.hlen = bios->data[uVar8];
      iVar12 = 0;
    }
    else {
      (bios->power).base_clock.hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar12 = -0xe;
    }
    uVar8 = (bios->power).base_clock.offset + 2;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.rlen = bios->data[uVar8];
      iVar11 = 0;
    }
    else {
      (bios->power).base_clock.rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar11 = -0xe;
    }
    uVar8 = (bios->power).base_clock.offset + 3;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.entriesnum = bios->data[uVar8];
      iVar3 = 0;
    }
    else {
      (bios->power).base_clock.entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar3 = -0xe;
    }
    uVar8 = (bios->power).base_clock.offset + 4;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.secount = bios->data[uVar8];
      iVar4 = 0;
    }
    else {
      (bios->power).base_clock.secount = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    uVar8 = (bios->power).base_clock.offset + 5;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.selen = bios->data[uVar8];
      iVar5 = 0;
    }
    else {
      (bios->power).base_clock.selen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar5 = -0xe;
    }
    (bios->power).base_clock.valid =
         (((iVar11 == 0 && iVar12 == 0) && iVar3 == 0) && iVar4 == 0) && iVar5 == 0;
    if ((((iVar11 != 0 || iVar12 != 0) || iVar3 != 0) || iVar4 != 0) || iVar5 != 0) {
      return -0x16;
    }
    uVar8 = (bios->power).base_clock.offset + 6;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.boost_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.boost_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 7;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.turbo_boost_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.turbo_boost_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 8;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.rated_tdp_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.rated_tdp_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 0xc;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.vrhot_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.vrhot_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 0xd;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.max_batt_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.max_batt_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 0xe;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.unk15_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.unk15_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 0xf;
  }
  else {
    if (uVar1 != '\x10') {
      fprintf(_stderr,"BASE CLOCKS table version 0x%x\n");
      return -0x16;
    }
    uVar8 = (bios->power).base_clock.offset + 1;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.hlen = bios->data[uVar8];
      iVar12 = 0;
    }
    else {
      (bios->power).base_clock.hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar12 = -0xe;
    }
    uVar8 = (bios->power).base_clock.offset + 2;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.rlen = bios->data[uVar8];
      iVar11 = 0;
    }
    else {
      (bios->power).base_clock.rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar11 = -0xe;
    }
    uVar8 = (bios->power).base_clock.offset + 3;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.selen = bios->data[uVar8];
      iVar3 = 0;
    }
    else {
      (bios->power).base_clock.selen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar3 = -0xe;
    }
    uVar8 = (bios->power).base_clock.offset + 4;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.secount = bios->data[uVar8];
      iVar4 = 0;
    }
    else {
      (bios->power).base_clock.secount = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    uVar8 = (bios->power).base_clock.offset + 5;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.entriesnum = bios->data[uVar8];
      iVar5 = 0;
    }
    else {
      (bios->power).base_clock.entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar5 = -0xe;
    }
    (bios->power).base_clock.valid =
         (((iVar11 == 0 && iVar12 == 0) && iVar3 == 0) && iVar4 == 0) && iVar5 == 0;
    if ((((iVar11 != 0 || iVar12 != 0) || iVar3 != 0) || iVar4 != 0) || iVar5 != 0) {
      return -0x16;
    }
    uVar8 = (bios->power).base_clock.offset + 6;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.d2_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.d2_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 7;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.d3_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.d3_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 8;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.d4_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.d4_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 9;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.d5_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.d5_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 10;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.over_current_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.over_current_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 0xb;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.vrhot_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.vrhot_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 0xc;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.max_batt_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.max_batt_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 0xd;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.max_sli_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.max_sli_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 0xe;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.max_therm_sustain_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.max_therm_sustain_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar8 = (bios->power).base_clock.offset + 0xf;
    if (uVar8 < bios->length) {
      (bios->power).base_clock.boost_entry = bios->data[uVar8];
    }
    else {
      (bios->power).base_clock.boost_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->power).base_clock.hlen < 0x11) {
      (bios->power).base_clock.turbo_boost_entry = 0xff;
    }
    else {
      uVar8 = (bios->power).base_clock.offset + 0x10;
      if (uVar8 < bios->length) {
        (bios->power).base_clock.turbo_boost_entry = bios->data[uVar8];
      }
      else {
        (bios->power).base_clock.turbo_boost_entry = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      }
    }
    if ((bios->power).base_clock.hlen < 0x12) {
      (bios->power).base_clock.rated_tdp_entry = 0xff;
    }
    else {
      uVar8 = (bios->power).base_clock.offset + 0x11;
      if (uVar8 < bios->length) {
        (bios->power).base_clock.rated_tdp_entry = bios->data[uVar8];
      }
      else {
        (bios->power).base_clock.rated_tdp_entry = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      }
    }
    if ((bios->power).base_clock.hlen < 0x13) {
      (bios->power).base_clock.slowdown_pwr_entry = 0xff;
    }
    else {
      uVar8 = (bios->power).base_clock.offset + 0x12;
      if (uVar8 < bios->length) {
        (bios->power).base_clock.slowdown_pwr_entry = bios->data[uVar8];
      }
      else {
        (bios->power).base_clock.slowdown_pwr_entry = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      }
    }
    if ((bios->power).base_clock.hlen < 0x14) {
      (bios->power).base_clock.mid_point_entry = 0xff;
    }
    else {
      uVar8 = (bios->power).base_clock.offset + 0x13;
      if (uVar8 < bios->length) {
        (bios->power).base_clock.mid_point_entry = bios->data[uVar8];
      }
      else {
        (bios->power).base_clock.mid_point_entry = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      }
    }
    if ((bios->power).base_clock.hlen < 0x16) {
      (bios->power).base_clock.unk15_entry = 0xff;
    }
    else {
      uVar8 = (bios->power).base_clock.offset + 0x15;
      if (uVar8 < bios->length) {
        (bios->power).base_clock.unk15_entry = bios->data[uVar8];
      }
      else {
        (bios->power).base_clock.unk15_entry = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      }
    }
    if ((bios->power).base_clock.hlen < 0x17) {
      (bios->power).base_clock.unk16_entry = 0xff;
      goto LAB_0025f989;
    }
    uVar8 = (bios->power).base_clock.offset + 0x16;
  }
  if (uVar8 < bios->length) {
    (bios->power).base_clock.unk16_entry = bios->data[uVar8];
  }
  else {
    (bios->power).base_clock.unk16_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
  }
LAB_0025f989:
  bVar2 = (bios->power).base_clock.entriesnum;
  peVar6 = (envy_bios_power_base_clock_entry *)malloc((ulong)((uint)bVar2 * 8) * 3);
  (bios->power).base_clock.entries = peVar6;
  if (bVar2 != 0) {
    uVar9 = 0;
    do {
      peVar6 = (bios->power).base_clock.entries + uVar9;
      uVar8 = (int)uVar9 *
              ((uint)(bios->power).base_clock.secount * (uint)(bios->power).base_clock.selen +
              (uint)(bios->power).base_clock.rlen) +
              (uint)(bios->power).base_clock.hlen + (bios->power).base_clock.offset;
      peVar6->offset = uVar8;
      if (uVar8 < bios->length) {
        peVar6->pstate = bios->data[uVar8];
      }
      else {
        peVar6->pstate = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      }
      if ((bios->power).base_clock.version == '\x10') {
        uVar8 = peVar6->offset + 2;
        if (uVar8 < bios->length) {
          peVar6->reqPower = CONCAT11(bios->data[uVar8],bios->data[peVar6->offset + 1]);
        }
        else {
          peVar6->reqPower = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        }
        uVar8 = peVar6->offset + 4;
        if (uVar8 < bios->length) {
          peVar6->reqSlowdownPower = CONCAT11(bios->data[uVar8],bios->data[peVar6->offset + 3]);
        }
        else {
          peVar6->reqSlowdownPower = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        }
      }
      bVar2 = (bios->power).base_clock.secount;
      puVar7 = (uint16_t *)malloc((ulong)((uint)bVar2 + (uint)bVar2));
      peVar6->clock = puVar7;
      if (bVar2 != 0) {
        uVar13 = 0;
        do {
          uVar8 = (uint)(bios->power).base_clock.selen * (int)uVar13 +
                  (uint)(bios->power).base_clock.rlen + peVar6->offset;
          uVar1 = (bios->power).base_clock.version;
          if (uVar1 == ' ') {
            if (uVar8 + 3 < bios->length) {
              uVar10 = (ushort)bios->data[uVar8 + 3] * 0x400 + (ushort)bios->data[uVar8 + 2] * 4;
            }
            else {
              uVar10 = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)(uVar8 + 2));
            }
            peVar6->clock[uVar13] = uVar10;
          }
          else if (uVar1 == '\x10') {
            if (uVar8 + 1 < bios->length) {
              peVar6->clock[uVar13] = CONCAT11(bios->data[uVar8 + 1],bios->data[uVar8]);
            }
            else {
              peVar6->clock[uVar13] = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (bios->power).base_clock.secount);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (bios->power).base_clock.entriesnum);
  }
  return 0;
}

Assistant:

int envy_bios_parse_power_base_clock(struct envy_bios *bios) {
	struct envy_bios_power_base_clock *bc = &bios->power.base_clock;
	int i, j, err = 0;

	if (!bc->offset)
		return -EINVAL;

	bios_u8(bios, bc->offset + 0x0, &bc->version);
	switch(bc->version) {
	case 0x10:
		err |= bios_u8(bios, bc->offset + 0x1, &bc->hlen);
		err |= bios_u8(bios, bc->offset + 0x2, &bc->rlen);
		err |= bios_u8(bios, bc->offset + 0x3, &bc->selen);
		err |= bios_u8(bios, bc->offset + 0x4, &bc->secount);
		err |= bios_u8(bios, bc->offset + 0x5, &bc->entriesnum);
		bc->valid = !err;

		if (bc->valid) {
			bios_u8(bios, bc->offset + 0x06, &bc->d2_entry);
			bios_u8(bios, bc->offset + 0x07, &bc->d3_entry);
			bios_u8(bios, bc->offset + 0x08, &bc->d4_entry);
			bios_u8(bios, bc->offset + 0x09, &bc->d5_entry);
			bios_u8(bios, bc->offset + 0x0a, &bc->over_current_entry);
			bios_u8(bios, bc->offset + 0x0b, &bc->vrhot_entry);
			bios_u8(bios, bc->offset + 0x0c, &bc->max_batt_entry);
			bios_u8(bios, bc->offset + 0x0d, &bc->max_sli_entry);
			bios_u8(bios, bc->offset + 0x0e, &bc->max_therm_sustain_entry);
			bios_u8(bios, bc->offset + 0x0f, &bc->boost_entry);
			if (bc->hlen > 0x10)
				bios_u8(bios, bc->offset + 0x10, &bc->turbo_boost_entry);
			else
				bc->turbo_boost_entry = 0xff;
			if (bc->hlen > 0x11)
				bios_u8(bios, bc->offset + 0x11, &bc->rated_tdp_entry);
			else
				bc->rated_tdp_entry = 0xff;
			if (bc->hlen > 0x12)
				bios_u8(bios, bc->offset + 0x12, &bc->slowdown_pwr_entry);
			else
				bc->slowdown_pwr_entry = 0xff;
			if (bc->hlen > 0x13)
				bios_u8(bios, bc->offset + 0x13, &bc->mid_point_entry);
			else
				bc->mid_point_entry = 0xff;
			if (bc->hlen > 0x15)
				bios_u8(bios, bc->offset + 0x15, &bc->unk15_entry);
			else
				bc->unk15_entry = 0xff;
			if (bc->hlen > 0x16)
				bios_u8(bios, bc->offset + 0x16, &bc->unk16_entry);
			else
				bc->unk16_entry = 0xff;
		} else {
			return -EINVAL;
		}

		break;
	case 0x20:
		err |= bios_u8(bios, bc->offset + 0x1, &bc->hlen);
		err |= bios_u8(bios, bc->offset + 0x2, &bc->rlen);
		err |= bios_u8(bios, bc->offset + 0x3, &bc->entriesnum);
		err |= bios_u8(bios, bc->offset + 0x4, &bc->secount);
		err |= bios_u8(bios, bc->offset + 0x5, &bc->selen);
		bc->valid = !err;

		if (bc->valid) {
			bios_u8(bios, bc->offset + 0x06, &bc->boost_entry);
			bios_u8(bios, bc->offset + 0x07, &bc->turbo_boost_entry);
			bios_u8(bios, bc->offset + 0x08, &bc->rated_tdp_entry);
			bios_u8(bios, bc->offset + 0x0c, &bc->vrhot_entry);
			bios_u8(bios, bc->offset + 0x0d, &bc->max_batt_entry);
			bios_u8(bios, bc->offset + 0x0e, &bc->unk15_entry);
			bios_u8(bios, bc->offset + 0x0f, &bc->unk16_entry);
		} else {
			return -EINVAL;
		}

		break;
	default:
		ENVY_BIOS_ERR("BASE CLOCKS table version 0x%x\n", bc->version);
		return -EINVAL;
	};

	err = 0;
	bc->entries = malloc(bc->entriesnum * sizeof(struct envy_bios_power_base_clock_entry));
	for (i = 0; i < bc->entriesnum; i++) {
		struct envy_bios_power_base_clock_entry *bce = &bc->entries[i];

		bce->offset = bc->offset + bc->hlen + i * (bc->rlen + (bc->selen * bc->secount));
		bios_u8(bios, bce->offset, &bce->pstate);

		if (bc->version == 0x10) {
			bios_u16(bios, bce->offset + 0x1, &bce->reqPower);
			bios_u16(bios, bce->offset + 0x3, &bce->reqSlowdownPower);
		}

		bce->clock = malloc(bc->secount * sizeof(uint16_t));
		for (j = 0; j < bc->secount; j++) {
			uint32_t suboffset = bce->offset + bc->rlen + j * bc->selen;
			uint16_t clock;
			switch (bc->version) {
			case 0x10:
				bios_u16(bios, suboffset, &bce->clock[j]);
				break;
			case 0x20:
				bios_u16(bios, suboffset + 0x2, &clock);
				bce->clock[j] = clock * 4;
				break;
			}
		}
	}

	return 0;
}